

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O0

Dictionary * ASDCP::DefaultCompositeDict(void)

{
  AutoMutex local_10;
  AutoMutex AL;
  
  if (!s_CompositeDictInit) {
    Kumu::AutoMutex::AutoMutex(&local_10,&s_CompositeDictLock);
    if ((s_CompositeDictInit & 1U) == 0) {
      Dictionary::Init(&s_CompositeDict);
      s_CompositeDictInit = true;
    }
    Kumu::AutoMutex::~AutoMutex(&local_10);
  }
  return &s_CompositeDict;
}

Assistant:

const ASDCP::Dictionary&
ASDCP::DefaultCompositeDict()
{
  if ( ! s_CompositeDictInit )
    {
      Kumu::AutoMutex AL(s_CompositeDictLock);

      if ( ! s_CompositeDictInit )
	{
	  s_CompositeDict.Init();
	  s_CompositeDictInit = true;
	}
    }

  return s_CompositeDict;
}